

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::SourceCodeInfo_Location::MergePartialFromCodedStream
          (SourceCodeInfo_Location *this,CodedInputStream *input)

{
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  Limit LVar4;
  int iVar5;
  string *psVar6;
  uint32 tag;
  uint32 length;
  uint32 local_48;
  uint32 local_44;
  RepeatedField<int> *local_40;
  UnknownFieldSet *local_38;
  
  local_40 = &this->path_;
  local_38 = &this->_unknown_fields_;
LAB_001faec6:
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (tag = (uint32)(char)*puVar1, -1 < (char)*puVar1)) {
    input->last_tag_ = tag;
    input->buffer_ = puVar1 + 1;
  }
  else {
    tag = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = tag;
  }
  if (tag == 0) {
    return true;
  }
  uVar3 = tag & 7;
  switch(tag >> 3) {
  case 1:
    if (uVar3 == 0) {
      bVar2 = internal::WireFormatLite::
              ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (1,10,input,local_40);
      if (!bVar2) {
        return false;
      }
    }
    else {
      if (uVar3 != 2) goto switchD_001faf1e_default;
      bVar2 = io::CodedInputStream::ReadVarint32(input,&length);
      if (!bVar2) {
        return false;
      }
      LVar4 = io::CodedInputStream::PushLimit(input,length);
      while (iVar5 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar5) {
        bVar2 = io::CodedInputStream::ReadVarint32(input,&local_44);
        if (!bVar2) {
          return false;
        }
        local_48 = local_44;
        RepeatedField<int>::Add(local_40,(int *)&local_48);
      }
      io::CodedInputStream::PopLimit(input,LVar4);
    }
    puVar1 = input->buffer_;
    if ((input->buffer_end_ <= puVar1) || (*puVar1 != '\x12')) goto LAB_001faec6;
    input->buffer_ = puVar1 + 1;
LAB_001fb035:
    bVar2 = io::CodedInputStream::ReadVarint32(input,&length);
    if (!bVar2) {
      return false;
    }
    LVar4 = io::CodedInputStream::PushLimit(input,length);
    while (iVar5 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar5) {
      bVar2 = io::CodedInputStream::ReadVarint32(input,&local_44);
      if (!bVar2) {
        return false;
      }
      local_48 = local_44;
      RepeatedField<int>::Add(&this->span_,(int *)&local_48);
    }
    io::CodedInputStream::PopLimit(input,LVar4);
    break;
  case 2:
    if (uVar3 != 0) {
      if (uVar3 != 2) goto switchD_001faf1e_default;
      goto LAB_001fb035;
    }
    bVar2 = internal::WireFormatLite::
            ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (1,0x12,input,&this->span_);
    if (!bVar2) {
      return false;
    }
    break;
  case 3:
    if (uVar3 != 2) goto switchD_001faf1e_default;
    goto LAB_001fb0b5;
  case 4:
    if (uVar3 != 2) goto switchD_001faf1e_default;
    goto LAB_001fb0fb;
  default:
    goto switchD_001faf1e_default;
  }
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (*puVar1 == '\x1a')) {
    input->buffer_ = puVar1 + 1;
LAB_001fb0b5:
    psVar6 = mutable_leading_comments_abi_cxx11_(this);
    bVar2 = internal::WireFormatLite::ReadString(input,psVar6);
    if (!bVar2) {
      return false;
    }
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->leading_comments_->_M_dataplus)._M_p,
               (int)this->leading_comments_->_M_string_length,PARSE);
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (*puVar1 == '\"')) {
      input->buffer_ = puVar1 + 1;
LAB_001fb0fb:
      psVar6 = mutable_trailing_comments_abi_cxx11_(this);
      bVar2 = internal::WireFormatLite::ReadString(input,psVar6);
      if (!bVar2) {
        return false;
      }
      internal::WireFormat::VerifyUTF8StringFallback
                ((this->trailing_comments_->_M_dataplus)._M_p,
                 (int)this->trailing_comments_->_M_string_length,PARSE);
      bVar2 = io::CodedInputStream::ExpectAtEnd(input);
      if (bVar2) {
        return true;
      }
    }
  }
  goto LAB_001faec6;
switchD_001faf1e_default:
  if (uVar3 == 4) {
    return true;
  }
  bVar2 = internal::WireFormat::SkipField(input,tag,local_38);
  if (!bVar2) {
    return false;
  }
  goto LAB_001faec6;
}

Assistant:

bool SourceCodeInfo_Location::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int32 path = 1 [packed = true];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_path())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 10, input, this->mutable_path())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_span;
        break;
      }

      // repeated int32 span = 2 [packed = true];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_span:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_span())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18, input, this->mutable_span())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_leading_comments;
        break;
      }

      // optional string leading_comments = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_leading_comments:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_leading_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->leading_comments().data(), this->leading_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_trailing_comments;
        break;
      }

      // optional string trailing_comments = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_trailing_comments:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_trailing_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->trailing_comments().data(), this->trailing_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}